

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureCompareFuncCase::test
          (TextureCompareFuncCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TesterType tester;
  GLint param;
  uint expected;
  TestLog *pTVar1;
  bool bVar2;
  bool bVar3;
  GLenum GVar4;
  GLuint expected_00;
  long lVar5;
  GLint value;
  ScopedLogSection section;
  ScopedLogSection section_1;
  allocator<char> local_f5;
  GLuint local_f4;
  ResultCollector *local_f0;
  code *local_e8;
  GLenum local_e0;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  ScopedLogSection local_38;
  
  tester = (this->super_TextureTest).m_tester;
  local_f0 = result;
  bVar2 = isPureIntTester(tester);
  bVar3 = true;
  if (!bVar2) {
    bVar2 = isPureUintTester(tester);
    if (!bVar2) {
      pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Initial",(allocator<char> *)&local_b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"Initial",(allocator<char> *)&local_58);
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_98,pTVar1,&local_78,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_78);
      StateQueryUtil::verifyStateTextureParamInteger
                (local_f0,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 0x203,(this->super_TextureTest).m_type);
      tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_98);
      bVar3 = false;
    }
  }
  pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Set",(allocator<char> *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Set",(allocator<char> *)&local_b8);
  tcu::ScopedLogSection::ScopedLogSection(&local_38,pTVar1,&local_78,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar3) {
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 4) {
      bVar3 = isPureIntTester((this->super_TextureTest).m_tester);
      if (bVar3) {
        expected_00 = *(GLuint *)((long)&DAT_01904540 + lVar5);
        local_f4 = expected_00;
        glu::CallLogWrapper::glTexParameterIiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   (GLint *)&local_f4);
        GVar4 = glu::CallLogWrapper::glGetError(gl);
        if (GVar4 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"Got Error ",&local_f5);
          local_e8 = glu::getErrorName;
          local_e0 = GVar4;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_e8);
          std::operator+(&local_98,&local_b8,&local_58);
          std::operator+(&local_d8,&local_98,": ");
          std::operator+(&local_78,&local_d8,"glTexParameterIiv");
          tcu::ResultCollector::fail(local_f0,&local_78);
LAB_014dfa9b:
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_b8);
        }
      }
      else {
        expected_00 = *(GLuint *)((long)&DAT_01904540 + lVar5);
        local_f4 = expected_00;
        glu::CallLogWrapper::glTexParameterIuiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_f4
                  );
        GVar4 = glu::CallLogWrapper::glGetError(gl);
        if (GVar4 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"Got Error ",&local_f5);
          local_e8 = glu::getErrorName;
          local_e0 = GVar4;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_e8);
          std::operator+(&local_98,&local_b8,&local_58);
          std::operator+(&local_d8,&local_98,": ");
          std::operator+(&local_78,&local_d8,"glTexParameterIuiv");
          tcu::ResultCollector::fail(local_f0,&local_78);
          goto LAB_014dfa9b;
        }
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_f0,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 expected_00,(this->super_TextureTest).m_type);
    }
  }
  else {
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 4) {
      param = *(GLint *)((long)&DAT_01904540 + lVar5);
      glu::CallLogWrapper::glTexParameteri
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,param);
      GVar4 = glu::CallLogWrapper::glGetError(gl);
      if (GVar4 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Got Error ",(allocator<char> *)&local_f4);
        local_e8 = glu::getErrorName;
        local_e0 = GVar4;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_e8);
        std::operator+(&local_98,&local_b8,&local_58);
        std::operator+(&local_d8,&local_98,": ");
        std::operator+(&local_78,&local_d8,"glTexParameteri");
        tcu::ResultCollector::fail(local_f0,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_f0,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 param,(this->super_TextureTest).m_type);
    }
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 4) {
      expected = *(uint *)((long)&DAT_01904540 + lVar5);
      glu::CallLogWrapper::glTexParameterf
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 (float)expected);
      GVar4 = glu::CallLogWrapper::glGetError(gl);
      if (GVar4 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Got Error ",(allocator<char> *)&local_f4);
        local_e8 = glu::getErrorName;
        local_e0 = GVar4;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_e8);
        std::operator+(&local_98,&local_b8,&local_58);
        std::operator+(&local_d8,&local_98,": ");
        std::operator+(&local_78,&local_d8,"glTexParameterf");
        tcu::ResultCollector::fail(local_f0,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_f0,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 expected,(this->super_TextureTest).m_type);
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_38);
  return;
}

Assistant:

void TextureCompareFuncCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool isPureCase = isPureIntTester(m_tester) || isPureUintTester(m_tester);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_LEQUAL, m_type);
	}

	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const GLenum				compareFuncs[]	= {GL_LEQUAL, GL_GEQUAL, GL_LESS, GL_GREATER, GL_EQUAL, GL_NOTEQUAL, GL_ALWAYS, GL_NEVER};

		if (isPureCase)
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(compareFuncs); ++ndx)
			{
				if (isPureIntTester(m_tester))
				{
					const glw::GLint value = (glw::GLint)compareFuncs[ndx];
					gl.glTexParameterIiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));

					const glw::GLuint value = compareFuncs[ndx];
					gl.glTexParameterIuiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
				}

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, compareFuncs[ndx], m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(compareFuncs); ++ndx)
			{
				gl.glTexParameteri(m_target, m_pname, compareFuncs[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, compareFuncs[ndx], m_type);
			}

			//check unit conversions with float

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(compareFuncs); ++ndx)
			{
				gl.glTexParameterf(m_target, m_pname, (GLfloat)compareFuncs[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, compareFuncs[ndx], m_type);
			}
		}
	}
}